

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xmlreader(void)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  xmlParserInputBufferPtr pxVar74;
  undefined8 uVar75;
  ulong uVar76;
  ulong uVar77;
  long lVar78;
  xmlDocPtr pxVar79;
  long lVar80;
  xmlNodePtr pxVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  int n_options_2;
  uint uVar84;
  uint uVar85;
  ulong *puVar86;
  int n_URI_1;
  uint uVar87;
  ulong in_RSI;
  xmlParserInputBufferPtr pxVar88;
  char *pcVar89;
  undefined8 *puVar90;
  int test_ret_11;
  undefined **ppuVar91;
  int test_ret_12;
  undefined4 uVar92;
  undefined4 *puVar93;
  int n_URI;
  uint uVar94;
  int test_ret;
  int test_ret_1;
  int test_ret_27;
  int test_ret_17;
  int test_ret_39;
  int test_ret_16;
  int test_ret_3;
  int test_ret_2;
  int test_ret_4;
  int test_ret_6;
  int test_ret_5;
  int local_88;
  int local_7c;
  undefined **local_78;
  undefined **local_60;
  int local_58;
  int local_54;
  undefined **local_48;
  int local_40;
  int local_3c;
  undefined **local_38;
  
  if (quiet == '\0') {
    puts("Testing xmlreader : 76 of 89 functions ...");
  }
  iVar1 = 0;
  uVar87 = 0;
  do {
    puVar86 = &DAT_0015ad80;
    uVar77 = 0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      pxVar74 = gen_xmlParserInputBufferPtr(uVar87,iVar4);
      uVar94 = (uint)uVar77;
      if (uVar94 < 7) {
        in_RSI = *puVar86;
      }
      else {
        in_RSI = 0;
      }
      uVar75 = xmlNewTextReader(pxVar74);
      xmlFreeTextReader(uVar75);
      call_tests = call_tests + 1;
      xmlFreeParserInputBuffer(pxVar74);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewTextReader",(ulong)(uint)(iVar4 - iVar3));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar87);
        printf(" %d");
        putchar(10);
        in_RSI = uVar77;
      }
      uVar94 = uVar94 + 1;
      uVar77 = (ulong)uVar94;
      puVar86 = puVar86 + 1;
    } while (uVar94 != 8);
    uVar87 = uVar87 + 1;
  } while (uVar87 != 8);
  function_tests = function_tests + 1;
  puVar90 = &DAT_0015ad80;
  uVar87 = 0;
  local_7c = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar87 < 7) {
      uVar75 = *puVar90;
    }
    else {
      uVar75 = 0;
    }
    xmlNewTextReaderFilename(uVar75);
    xmlFreeTextReader();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewTextReaderFilename",(ulong)(uint)(iVar4 - iVar3));
      local_7c = local_7c + 1;
      printf(" %d",(ulong)uVar87);
      putchar(10);
    }
    uVar87 = uVar87 + 1;
    puVar90 = puVar90 + 1;
  } while (uVar87 != 8);
  function_tests = function_tests + 1;
  local_54 = 0;
  uVar87 = 0;
  do {
    uVar77 = 0;
    do {
      uVar76 = 0;
      do {
        puVar93 = &DAT_00158230;
        uVar94 = 0;
        do {
          iVar3 = xmlMemBlocks();
          if (uVar87 < 4) {
            uVar75 = (&DAT_0015ad60)[uVar87];
          }
          else {
            uVar75 = 0;
          }
          if ((uint)uVar77 < 7) {
            uVar83 = (&DAT_0015ad80)[uVar77];
          }
          else {
            uVar83 = 0;
          }
          if ((uint)uVar76 < 3) {
            uVar82 = (&DAT_0015ad48)[uVar76];
          }
          else {
            uVar82 = 0;
          }
          uVar92 = 0x200;
          if (uVar94 < 4) {
            uVar92 = *puVar93;
          }
          xmlReaderForDoc(uVar75,uVar83,uVar82,uVar92);
          xmlFreeTextReader();
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReaderForDoc",(ulong)(uint)(iVar4 - iVar3));
            local_54 = local_54 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d",uVar77);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar93 = puVar93 + 1;
        } while (uVar94 != 5);
        uVar94 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar94;
      } while (uVar94 != 4);
      uVar94 = (uint)uVar77 + 1;
      uVar77 = (ulong)uVar94;
    } while (uVar94 != 8);
    uVar87 = uVar87 + 1;
  } while (uVar87 != 5);
  function_tests = function_tests + 1;
  local_58 = 0;
  uVar87 = 0;
  do {
    uVar77 = 0;
    do {
      uVar94 = 0;
      puVar93 = &DAT_00158230;
      do {
        iVar3 = xmlMemBlocks();
        if (uVar87 < 7) {
          uVar75 = (&DAT_0015ad80)[uVar87];
        }
        else {
          uVar75 = 0;
        }
        if ((uint)uVar77 < 3) {
          uVar83 = (&DAT_0015ad48)[uVar77];
        }
        else {
          uVar83 = 0;
        }
        uVar92 = 0x200;
        if (uVar94 < 4) {
          uVar92 = *puVar93;
        }
        xmlReaderForFile(uVar75,uVar83,uVar92);
        xmlFreeTextReader();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlReaderForFile",(ulong)(uint)(iVar4 - iVar3));
          local_58 = local_58 + 1;
          printf(" %d",(ulong)uVar87);
          printf(" %d",uVar77);
          printf(" %d");
          putchar(10);
        }
        uVar94 = uVar94 + 1;
        puVar93 = puVar93 + 1;
      } while (uVar94 != 5);
      uVar94 = (uint)uVar77 + 1;
      uVar77 = (ulong)uVar94;
    } while (uVar94 != 4);
    uVar87 = uVar87 + 1;
  } while (uVar87 != 8);
  function_tests = function_tests + 1;
  iVar3 = 0;
  iVar4 = 0;
  do {
    uVar87 = 0;
    do {
      uVar77 = 0;
      do {
        uVar94 = 0;
        do {
          uVar76 = (ulong)uVar94;
          uVar84 = 0;
          puVar93 = &DAT_00158230;
          do {
            iVar5 = xmlMemBlocks();
            if (iVar4 == 0) {
              pcVar89 = "foo";
LAB_0013ae59:
              bVar2 = false;
            }
            else {
              if (iVar4 == 2) {
                pcVar89 = "test/ent2";
                goto LAB_0013ae59;
              }
              if (iVar4 == 1) {
                bVar2 = false;
                pcVar89 = "<foo/>";
              }
              else {
                bVar2 = true;
                pcVar89 = (char *)0x0;
              }
            }
            iVar7 = -1;
            if (uVar87 < 4) {
              iVar7 = (&DAT_00158240)[uVar87];
            }
            if ((uint)uVar77 < 7) {
              uVar75 = (&DAT_0015ad80)[uVar77];
            }
            else {
              uVar75 = 0;
            }
            if (uVar94 < 3) {
              uVar83 = (&DAT_0015ad48)[uVar76];
            }
            else {
              uVar83 = 0;
            }
            uVar92 = 0x200;
            if (uVar84 < 4) {
              uVar92 = *puVar93;
            }
            if ((!bVar2) && (iVar6 = xmlStrlen(pcVar89,uVar76,uVar75), iVar6 < iVar7)) {
              iVar7 = 0;
            }
            xmlReaderForMemory(pcVar89,iVar7,uVar75,uVar83,uVar92);
            xmlFreeTextReader();
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar5 != iVar7) {
              iVar7 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlReaderForMemory",(ulong)(uint)(iVar7 - iVar5));
              iVar3 = iVar3 + 1;
              printf(" %d",iVar4);
              printf(" %d",(ulong)uVar87);
              printf(" %d",uVar77);
              printf(" %d",uVar76);
              printf(" %d");
              putchar(10);
            }
            uVar84 = uVar84 + 1;
            puVar93 = puVar93 + 1;
          } while (uVar84 != 5);
          uVar94 = uVar94 + 1;
        } while (uVar94 != 4);
        uVar94 = (uint)uVar77 + 1;
        uVar77 = (ulong)uVar94;
      } while (uVar94 != 8);
      uVar87 = uVar87 + 1;
    } while (uVar87 != 4);
    iVar4 = iVar4 + 1;
    if (iVar4 == 4) {
      function_tests = function_tests + 1;
      local_38 = &PTR_anon_var_dwarf_6db_0015ad08;
      local_3c = 0;
      uVar87 = 0;
      do {
        uVar77 = 0;
        do {
          uVar94 = 0;
          do {
            uVar84 = 0;
            do {
              uVar85 = 0;
              puVar93 = &DAT_00158230;
              do {
                iVar4 = xmlMemBlocks();
                if (uVar87 < 3) {
                  lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
                }
                else {
                  lVar78 = 0;
                }
                if ((uint)uVar77 < 4) {
                  uVar75 = (&DAT_0015ad60)[uVar77];
                }
                else {
                  uVar75 = 0;
                }
                if (uVar94 < 7) {
                  uVar83 = (&DAT_0015ad80)[uVar94];
                }
                else {
                  uVar83 = 0;
                }
                if (uVar84 < 3) {
                  uVar82 = (&DAT_0015ad48)[uVar84];
                }
                else {
                  uVar82 = 0;
                }
                uVar92 = 0x200;
                if (uVar85 < 4) {
                  uVar92 = *puVar93;
                }
                xmlReaderNewDoc(lVar78,uVar75,uVar83,uVar82,uVar92);
                call_tests = call_tests + 1;
                if (lVar78 != 0) {
                  xmlFreeTextReader(lVar78);
                }
                xmlResetLastError();
                iVar5 = xmlMemBlocks();
                if (iVar4 != iVar5) {
                  iVar5 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlReaderNewDoc",(ulong)(uint)(iVar5 - iVar4));
                  local_3c = local_3c + 1;
                  printf(" %d",(ulong)uVar87);
                  printf(" %d",uVar77);
                  printf(" %d",(ulong)uVar94);
                  printf(" %d",(ulong)uVar84);
                  printf(" %d");
                  putchar(10);
                }
                uVar85 = uVar85 + 1;
                puVar93 = puVar93 + 1;
              } while (uVar85 != 5);
              uVar84 = uVar84 + 1;
            } while (uVar84 != 4);
            uVar94 = uVar94 + 1;
          } while (uVar94 != 8);
          uVar94 = (uint)uVar77 + 1;
          uVar77 = (ulong)uVar94;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      iVar1 = local_7c + iVar1 + local_54 + local_58;
      function_tests = function_tests + 1;
      local_40 = 0;
      uVar87 = 0;
      do {
        uVar77 = 0;
        do {
          uVar94 = 0;
          do {
            puVar93 = &DAT_00158230;
            uVar84 = 0;
            do {
              iVar4 = xmlMemBlocks();
              if (uVar87 < 3) {
                lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
              }
              else {
                lVar78 = 0;
              }
              if ((uint)uVar77 < 7) {
                uVar75 = (&DAT_0015ad80)[uVar77];
              }
              else {
                uVar75 = 0;
              }
              if (uVar94 < 3) {
                uVar83 = (&DAT_0015ad48)[uVar94];
              }
              else {
                uVar83 = 0;
              }
              uVar92 = 0x200;
              if (uVar84 < 4) {
                uVar92 = *puVar93;
              }
              xmlReaderNewFile(lVar78,uVar75,uVar83,uVar92);
              call_tests = call_tests + 1;
              if (lVar78 != 0) {
                xmlFreeTextReader();
              }
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar4 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlReaderNewFile",(ulong)(uint)(iVar5 - iVar4));
                local_40 = local_40 + 1;
                printf(" %d",(ulong)uVar87);
                printf(" %d",uVar77);
                printf(" %d",(ulong)uVar94);
                printf(" %d");
                putchar(10);
              }
              uVar84 = uVar84 + 1;
              puVar93 = puVar93 + 1;
            } while (uVar84 != 5);
            uVar94 = uVar94 + 1;
          } while (uVar94 != 4);
          uVar94 = (uint)uVar77 + 1;
          uVar77 = (ulong)uVar94;
        } while (uVar94 != 8);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      local_58 = 0;
      uVar87 = 0;
      do {
        iVar4 = 0;
        do {
          uVar77 = 0;
          do {
            uVar94 = 0;
            do {
              uVar84 = 0;
              do {
                puVar93 = &DAT_00158230;
                uVar85 = 0;
                do {
                  iVar5 = xmlMemBlocks();
                  if (uVar87 < 3) {
                    lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
                  }
                  else {
                    lVar78 = 0;
                  }
                  if (iVar4 == 0) {
                    bVar2 = false;
                    pcVar89 = "foo";
                  }
                  else if (iVar4 == 2) {
                    bVar2 = false;
                    pcVar89 = "test/ent2";
                  }
                  else if (iVar4 == 1) {
                    bVar2 = false;
                    pcVar89 = "<foo/>";
                  }
                  else {
                    bVar2 = true;
                    pcVar89 = (char *)0x0;
                  }
                  iVar7 = -1;
                  if ((uint)uVar77 < 4) {
                    iVar7 = (&DAT_00158240)[uVar77];
                  }
                  if (uVar94 < 7) {
                    uVar75 = (&DAT_0015ad80)[uVar94];
                  }
                  else {
                    uVar75 = 0;
                  }
                  if (uVar84 < 3) {
                    uVar83 = (&DAT_0015ad48)[uVar84];
                  }
                  else {
                    uVar83 = 0;
                  }
                  uVar92 = 0x200;
                  if (uVar85 < 4) {
                    uVar92 = *puVar93;
                  }
                  if ((!bVar2) && (iVar6 = xmlStrlen(pcVar89), iVar6 < iVar7)) {
                    iVar7 = 0;
                  }
                  xmlReaderNewMemory(lVar78,pcVar89,iVar7,uVar75,uVar83,uVar92);
                  call_tests = call_tests + 1;
                  if (lVar78 != 0) {
                    xmlFreeTextReader();
                  }
                  xmlResetLastError();
                  iVar7 = xmlMemBlocks();
                  if (iVar5 != iVar7) {
                    iVar7 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlReaderNewMemory",
                           (ulong)(uint)(iVar7 - iVar5));
                    local_58 = local_58 + 1;
                    printf(" %d",(ulong)uVar87);
                    printf(" %d",iVar4);
                    printf(" %d",uVar77);
                    printf(" %d",(ulong)uVar94);
                    printf(" %d",(ulong)uVar84);
                    pcVar89 = (char *)(ulong)uVar85;
                    printf(" %d");
                    putchar(10);
                  }
                  uVar85 = uVar85 + 1;
                  puVar93 = puVar93 + 1;
                } while (uVar85 != 5);
                uVar84 = uVar84 + 1;
              } while (uVar84 != 4);
              uVar94 = uVar94 + 1;
            } while (uVar94 != 8);
            uVar94 = (uint)uVar77 + 1;
            uVar77 = (ulong)uVar94;
          } while (uVar94 != 4);
          iVar4 = iVar4 + 1;
        } while (iVar4 != 4);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar4 = 0;
      uVar87 = 0;
      do {
        uVar94 = 0;
        do {
          iVar7 = (int)pcVar89;
          iVar5 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          pxVar79 = gen_xmlDocPtr(uVar94,iVar7);
          pcVar89 = (char *)pxVar79;
          xmlReaderNewWalker(lVar78);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          if (((pxVar79 != (xmlDocPtr)0x0) && (api_doc != pxVar79)) && (pxVar79->doc != api_doc)) {
            xmlFreeDoc(pxVar79);
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar5 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReaderNewWalker",(ulong)(uint)(iVar7 - iVar5));
            iVar4 = iVar4 + 1;
            printf(" %d",(ulong)uVar87);
            pcVar89 = (char *)(ulong)uVar94;
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
        } while (uVar94 != 4);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      uVar87 = 0;
      iVar5 = 0;
      do {
        iVar7 = xmlMemBlocks();
        pxVar79 = gen_xmlDocPtr(uVar87,(int)pcVar89);
        uVar75 = xmlReaderWalker(pxVar79);
        xmlFreeTextReader(uVar75);
        call_tests = call_tests + 1;
        if (((pxVar79 != (xmlDocPtr)0x0) && (api_doc != pxVar79)) && (pxVar79->doc != api_doc)) {
          xmlFreeDoc(pxVar79);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar7 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlReaderWalker",(ulong)(uint)(iVar6 - iVar7));
          iVar5 = iVar5 + 1;
          pcVar89 = (char *)(ulong)uVar87;
          printf(" %d");
          putchar(10);
        }
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      uVar87 = 0;
      iVar7 = 0;
      do {
        iVar6 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*local_38);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderAttributeCount(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar6 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderAttributeCount",
                 (ulong)(uint)(iVar8 - iVar6));
          iVar7 = iVar7 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        local_38 = local_38 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar6 = 0;
      do {
        iVar8 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        lVar80 = xmlTextReaderBaseUri(lVar78);
        if (lVar80 != 0) {
          (*_xmlFree)(lVar80);
        }
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderBaseUri",(ulong)(uint)(iVar9 - iVar8));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar8 = 0;
      do {
        iVar9 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderByteConsumed(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderByteConsumed",
                 (ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar9 = 0;
      do {
        iVar10 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderClose(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        if (iVar10 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderClose",(ulong)(uint)(iVar11 - iVar10));
          iVar9 = iVar9 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar10 = 0;
      do {
        iVar11 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderConstBaseUri(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar12 = xmlMemBlocks();
        if (iVar11 != iVar12) {
          iVar12 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstBaseUri",
                 (ulong)(uint)(iVar12 - iVar11));
          iVar10 = iVar10 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar11 = 0;
      do {
        iVar12 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderConstEncoding(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar12 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstEncoding",
                 (ulong)(uint)(iVar13 - iVar12));
          iVar11 = iVar11 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar12 = 0;
      do {
        iVar13 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderConstLocalName(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        if (iVar13 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstLocalName",
                 (ulong)(uint)(iVar14 - iVar13));
          iVar12 = iVar12 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar13 = 0;
      do {
        iVar14 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderConstName(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar15 = xmlMemBlocks();
        if (iVar14 != iVar15) {
          iVar15 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstName",(ulong)(uint)(iVar15 - iVar14))
          ;
          iVar13 = iVar13 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar14 = 0;
      do {
        iVar15 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderConstNamespaceUri(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstNamespaceUri",
                 (ulong)(uint)(iVar16 - iVar15));
          iVar14 = iVar14 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar15 = 0;
      do {
        iVar16 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderConstPrefix(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar17 = xmlMemBlocks();
        if (iVar16 != iVar17) {
          iVar17 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstPrefix",
                 (ulong)(uint)(iVar17 - iVar16));
          iVar15 = iVar15 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      local_78 = &PTR_anon_var_dwarf_6db_0015ad08;
      iVar16 = 0;
      uVar87 = 0;
      do {
        puVar90 = &DAT_0015ad60;
        uVar94 = 0;
        do {
          iVar17 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          if (uVar94 < 4) {
            uVar75 = *puVar90;
          }
          else {
            uVar75 = 0;
          }
          xmlTextReaderConstString(lVar78,uVar75);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar18 = xmlMemBlocks();
          if (iVar17 != iVar18) {
            iVar18 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderConstString",
                   (ulong)(uint)(iVar18 - iVar17));
            iVar16 = iVar16 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      uVar87 = 0;
      iVar17 = 0;
      do {
        iVar18 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*local_78);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderConstValue(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar19 = xmlMemBlocks();
        if (iVar18 != iVar19) {
          iVar19 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstValue",(ulong)(uint)(iVar19 - iVar18)
                );
          iVar17 = iVar17 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        local_78 = local_78 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar18 = 0;
      do {
        iVar19 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderConstXmlLang(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar20 = xmlMemBlocks();
        if (iVar19 != iVar20) {
          iVar20 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstXmlLang",
                 (ulong)(uint)(iVar20 - iVar19));
          iVar18 = iVar18 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar19 = 0;
      do {
        iVar20 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderConstXmlVersion(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar21 = xmlMemBlocks();
        if (iVar20 != iVar21) {
          iVar21 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderConstXmlVersion",
                 (ulong)(uint)(iVar21 - iVar20));
          iVar19 = iVar19 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar20 = 0;
      do {
        iVar21 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        pxVar79 = (xmlDocPtr)xmlTextReaderCurrentDoc(lVar78);
        if (api_doc != pxVar79) {
          xmlFreeDoc(pxVar79);
        }
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar22 = xmlMemBlocks();
        if (iVar21 != iVar22) {
          iVar22 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderCurrentDoc",(ulong)(uint)(iVar22 - iVar21)
                );
          iVar20 = iVar20 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar21 = 0;
      do {
        iVar22 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        pxVar81 = (xmlNodePtr)xmlTextReaderCurrentNode(lVar78);
        desret_xmlNodePtr(pxVar81);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar23 = xmlMemBlocks();
        if (iVar22 != iVar23) {
          iVar23 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderCurrentNode",
                 (ulong)(uint)(iVar23 - iVar22));
          iVar21 = iVar21 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar22 = 0;
      do {
        iVar23 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderDepth(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar24 = xmlMemBlocks();
        if (iVar23 != iVar24) {
          iVar24 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderDepth",(ulong)(uint)(iVar24 - iVar23));
          iVar22 = iVar22 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar23 = 0;
      do {
        iVar24 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        pxVar81 = (xmlNodePtr)xmlTextReaderExpand(lVar78);
        desret_xmlNodePtr(pxVar81);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar25 = xmlMemBlocks();
        if (iVar24 != iVar25) {
          iVar25 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderExpand",(ulong)(uint)(iVar25 - iVar24));
          iVar23 = iVar23 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      local_60 = &PTR_anon_var_dwarf_6db_0015ad08;
      iVar24 = 0;
      uVar87 = 0;
      do {
        puVar90 = &DAT_0015ad60;
        uVar94 = 0;
        do {
          iVar25 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          if (uVar94 < 4) {
            uVar75 = *puVar90;
          }
          else {
            uVar75 = 0;
          }
          lVar80 = xmlTextReaderGetAttribute(lVar78,uVar75);
          if (lVar80 != 0) {
            (*_xmlFree)(lVar80);
          }
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar26 = xmlMemBlocks();
          if (iVar25 != iVar26) {
            iVar26 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderGetAttribute",
                   (ulong)(uint)(iVar26 - iVar25));
            iVar24 = iVar24 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar25 = 0;
      uVar87 = 0;
      do {
        puVar93 = &DAT_00158240;
        uVar94 = 0;
        do {
          iVar26 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          lVar80 = xmlTextReaderGetAttributeNo(lVar78,*puVar93);
          if (lVar80 != 0) {
            (*_xmlFree)(lVar80);
          }
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar27 = xmlMemBlocks();
          if (iVar26 != iVar27) {
            iVar27 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderGetAttributeNo",
                   (ulong)(uint)(iVar27 - iVar26));
            iVar25 = iVar25 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d",(ulong)uVar94);
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar93 = puVar93 + 1;
        } while (uVar94 != 4);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar26 = 0;
      uVar87 = 0;
      do {
        uVar77 = 0;
        do {
          uVar94 = 0;
          puVar90 = &DAT_0015ad60;
          do {
            iVar27 = xmlMemBlocks();
            if (uVar87 < 3) {
              lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
            }
            else {
              lVar78 = 0;
            }
            if ((uint)uVar77 < 4) {
              uVar75 = (&DAT_0015ad60)[uVar77];
            }
            else {
              uVar75 = 0;
            }
            if (uVar94 < 4) {
              uVar83 = *puVar90;
            }
            else {
              uVar83 = 0;
            }
            lVar80 = xmlTextReaderGetAttributeNs(lVar78,uVar75,uVar83);
            if (lVar80 != 0) {
              (*_xmlFree)(lVar80);
            }
            call_tests = call_tests + 1;
            if (lVar78 != 0) {
              xmlFreeTextReader(lVar78);
            }
            xmlResetLastError();
            iVar28 = xmlMemBlocks();
            if (iVar27 != iVar28) {
              iVar28 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderGetAttributeNs",
                     (ulong)(uint)(iVar28 - iVar27));
              iVar26 = iVar26 + 1;
              printf(" %d",(ulong)uVar87);
              printf(" %d",uVar77);
              printf(" %d");
              putchar(10);
            }
            uVar94 = uVar94 + 1;
            puVar90 = puVar90 + 1;
          } while (uVar94 != 5);
          uVar94 = (uint)uVar77 + 1;
          uVar77 = (ulong)uVar94;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar27 = 0;
      uVar87 = 0;
      do {
        iVar28 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*local_60);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderGetErrorHandler(lVar78,0,0);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar29 = xmlMemBlocks();
        if (iVar28 != iVar29) {
          iVar29 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetErrorHandler",
                 (ulong)(uint)(iVar29 - iVar28));
          iVar27 = iVar27 + 1;
          printf(" %d");
          printf(" %d");
          printf(" %d");
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        local_60 = local_60 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar28 = 0;
      do {
        iVar29 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderGetParserColumnNumber(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar30 = xmlMemBlocks();
        if (iVar29 != iVar30) {
          iVar30 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetParserColumnNumber",
                 (ulong)(uint)(iVar30 - iVar29));
          iVar28 = iVar28 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar29 = 0;
      do {
        iVar30 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderGetParserLineNumber(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar31 = xmlMemBlocks();
        if (iVar30 != iVar31) {
          iVar31 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetParserLineNumber",
                 (ulong)(uint)(iVar31 - iVar30));
          iVar29 = iVar29 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      local_78 = &PTR_anon_var_dwarf_6db_0015ad08;
      iVar30 = 0;
      uVar87 = 0;
      do {
        puVar93 = &DAT_00158240;
        uVar94 = 0;
        do {
          iVar31 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          xmlTextReaderGetParserProp(lVar78,*puVar93);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar32 = xmlMemBlocks();
          if (iVar31 != iVar32) {
            iVar32 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderGetParserProp",
                   (ulong)(uint)(iVar32 - iVar31));
            iVar30 = iVar30 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d",(ulong)uVar94);
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar93 = puVar93 + 1;
        } while (uVar94 != 4);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      uVar87 = 0;
      iVar31 = 0;
      do {
        iVar32 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*local_78);
        }
        else {
          lVar78 = 0;
        }
        uVar75 = xmlTextReaderGetRemainder(lVar78);
        xmlFreeParserInputBuffer(uVar75);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar33 = xmlMemBlocks();
        if (iVar32 != iVar33) {
          iVar33 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderGetRemainder",
                 (ulong)(uint)(iVar33 - iVar32));
          iVar31 = iVar31 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        local_78 = local_78 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar32 = 0;
      do {
        iVar33 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderHasAttributes(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar34 = xmlMemBlocks();
        if (iVar33 != iVar34) {
          iVar34 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderHasAttributes",
                 (ulong)(uint)(iVar34 - iVar33));
          iVar32 = iVar32 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar33 = 0;
      do {
        iVar34 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderHasValue(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar35 = xmlMemBlocks();
        if (iVar34 != iVar35) {
          iVar35 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderHasValue",(ulong)(uint)(iVar35 - iVar34));
          iVar33 = iVar33 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar34 = 0;
      do {
        iVar35 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderIsDefault(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar36 = xmlMemBlocks();
        if (iVar35 != iVar36) {
          iVar36 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderIsDefault",(ulong)(uint)(iVar36 - iVar35))
          ;
          iVar34 = iVar34 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar35 = 0;
      do {
        iVar36 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderIsEmptyElement(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar37 = xmlMemBlocks();
        if (iVar36 != iVar37) {
          iVar37 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderIsEmptyElement",
                 (ulong)(uint)(iVar37 - iVar36));
          iVar35 = iVar35 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar36 = 0;
      do {
        iVar37 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderIsNamespaceDecl(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar38 = xmlMemBlocks();
        if (iVar37 != iVar38) {
          iVar38 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderIsNamespaceDecl",
                 (ulong)(uint)(iVar38 - iVar37));
          iVar36 = iVar36 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar37 = 0;
      do {
        iVar38 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderIsValid(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar39 = xmlMemBlocks();
        if (iVar38 != iVar39) {
          iVar39 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderIsValid",(ulong)(uint)(iVar39 - iVar38));
          iVar37 = iVar37 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar38 = 0;
      do {
        iVar39 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        lVar80 = xmlTextReaderLocalName(lVar78);
        if (lVar80 != 0) {
          (*_xmlFree)(lVar80);
        }
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar40 = xmlMemBlocks();
        if (iVar39 != iVar40) {
          iVar40 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderLocalName",(ulong)(uint)(iVar40 - iVar39))
          ;
          iVar38 = iVar38 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar39 = xmlMemBlocks();
      lVar78 = xmlTextReaderLocatorBaseURI(0);
      if (lVar78 != 0) {
        (*_xmlFree)(lVar78);
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar40 = xmlMemBlocks();
      if (iVar39 != iVar40) {
        iVar41 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderLocatorBaseURI",
               (ulong)(uint)(iVar41 - iVar39));
        printf(" %d",0);
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar41 = xmlMemBlocks();
      xmlTextReaderLocatorLineNumber(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar42 = xmlMemBlocks();
      if (iVar41 != iVar42) {
        iVar43 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderLocatorLineNumber",
               (ulong)(uint)(iVar43 - iVar41));
        printf(" %d",0);
        putchar(10);
      }
      function_tests = function_tests + 1;
      local_60 = &PTR_anon_var_dwarf_6db_0015ad08;
      iVar43 = 0;
      uVar87 = 0;
      do {
        uVar94 = 0;
        puVar90 = &DAT_0015ad60;
        do {
          iVar44 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          if (uVar94 < 4) {
            uVar75 = *puVar90;
          }
          else {
            uVar75 = 0;
          }
          lVar80 = xmlTextReaderLookupNamespace(lVar78,uVar75);
          if (lVar80 != 0) {
            (*_xmlFree)(lVar80);
          }
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar45 = xmlMemBlocks();
          if (iVar44 != iVar45) {
            iVar45 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderLookupNamespace",
                   (ulong)(uint)(iVar45 - iVar44));
            iVar43 = iVar43 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar44 = 0;
      uVar87 = 0;
      do {
        puVar90 = &DAT_0015ad60;
        uVar94 = 0;
        do {
          iVar45 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          if (uVar94 < 4) {
            uVar75 = *puVar90;
          }
          else {
            uVar75 = 0;
          }
          xmlTextReaderMoveToAttribute(lVar78,uVar75);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar46 = xmlMemBlocks();
          if (iVar45 != iVar46) {
            iVar46 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderMoveToAttribute",
                   (ulong)(uint)(iVar46 - iVar45));
            iVar44 = iVar44 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar45 = 0;
      uVar87 = 0;
      do {
        puVar93 = &DAT_00158240;
        uVar77 = 0;
        do {
          iVar46 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          xmlTextReaderMoveToAttributeNo(lVar78,*puVar93);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar47 = xmlMemBlocks();
          if (iVar46 != iVar47) {
            iVar47 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderMoveToAttributeNo",
                   (ulong)(uint)(iVar47 - iVar46));
            iVar45 = iVar45 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d",uVar77);
            putchar(10);
          }
          uVar94 = (int)uVar77 + 1;
          uVar77 = (ulong)uVar94;
          puVar93 = puVar93 + 1;
        } while (uVar94 != 4);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar46 = 0;
      uVar87 = 0;
      do {
        uVar77 = 0;
        do {
          uVar94 = 0;
          puVar90 = &DAT_0015ad60;
          do {
            iVar47 = xmlMemBlocks();
            if (uVar87 < 3) {
              lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
            }
            else {
              lVar78 = 0;
            }
            if ((uint)uVar77 < 4) {
              uVar75 = (&DAT_0015ad60)[uVar77];
            }
            else {
              uVar75 = 0;
            }
            if (uVar94 < 4) {
              uVar83 = *puVar90;
            }
            else {
              uVar83 = 0;
            }
            xmlTextReaderMoveToAttributeNs(lVar78,uVar75,uVar83);
            call_tests = call_tests + 1;
            if (lVar78 != 0) {
              xmlFreeTextReader(lVar78);
            }
            xmlResetLastError();
            iVar48 = xmlMemBlocks();
            if (iVar47 != iVar48) {
              iVar48 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderMoveToAttributeNs",
                     (ulong)(uint)(iVar48 - iVar47));
              iVar46 = iVar46 + 1;
              printf(" %d",(ulong)uVar87);
              printf(" %d",uVar77);
              printf(" %d");
              putchar(10);
            }
            uVar94 = uVar94 + 1;
            puVar90 = puVar90 + 1;
          } while (uVar94 != 5);
          uVar94 = (uint)uVar77 + 1;
          uVar77 = (ulong)uVar94;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      uVar87 = 0;
      iVar47 = 0;
      do {
        iVar48 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*local_60);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderMoveToElement(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar49 = xmlMemBlocks();
        if (iVar48 != iVar49) {
          iVar49 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderMoveToElement",
                 (ulong)(uint)(iVar49 - iVar48));
          iVar47 = iVar47 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        local_60 = local_60 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar48 = 0;
      do {
        iVar49 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderMoveToFirstAttribute(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar50 = xmlMemBlocks();
        if (iVar49 != iVar50) {
          iVar50 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderMoveToFirstAttribute",
                 (ulong)(uint)(iVar50 - iVar49));
          iVar48 = iVar48 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar49 = 0;
      do {
        iVar50 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderMoveToNextAttribute(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar51 = xmlMemBlocks();
        if (iVar50 != iVar51) {
          iVar51 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderMoveToNextAttribute",
                 (ulong)(uint)(iVar51 - iVar50));
          iVar49 = iVar49 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar50 = 0;
      do {
        iVar51 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        lVar80 = xmlTextReaderName(lVar78);
        if (lVar80 != 0) {
          (*_xmlFree)(lVar80);
        }
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar52 = xmlMemBlocks();
        if (iVar51 != iVar52) {
          iVar52 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderName",(ulong)(uint)(iVar52 - iVar51));
          iVar50 = iVar50 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar51 = 0;
      do {
        iVar52 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        lVar80 = xmlTextReaderNamespaceUri(lVar78);
        if (lVar80 != 0) {
          (*_xmlFree)(lVar80);
        }
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar53 = xmlMemBlocks();
        if (iVar52 != iVar53) {
          iVar53 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNamespaceUri",
                 (ulong)(uint)(iVar53 - iVar52));
          iVar51 = iVar51 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar52 = 0;
      do {
        iVar53 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderNext(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar54 = xmlMemBlocks();
        if (iVar53 != iVar54) {
          iVar54 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNext",(ulong)(uint)(iVar54 - iVar53));
          iVar52 = iVar52 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar53 = 0;
      do {
        iVar54 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderNextSibling(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar55 = xmlMemBlocks();
        if (iVar54 != iVar55) {
          iVar55 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNextSibling",
                 (ulong)(uint)(iVar55 - iVar54));
          iVar53 = iVar53 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar54 = 0;
      do {
        iVar55 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderNodeType(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar56 = xmlMemBlocks();
        if (iVar55 != iVar56) {
          iVar56 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNodeType",(ulong)(uint)(iVar56 - iVar55));
          iVar54 = iVar54 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar55 = 0;
      do {
        iVar56 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderNormalization(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar57 = xmlMemBlocks();
        if (iVar56 != iVar57) {
          iVar57 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderNormalization",
                 (ulong)(uint)(iVar57 - iVar56));
          iVar55 = iVar55 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar56 = 0;
      do {
        iVar57 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        lVar80 = xmlTextReaderPrefix(lVar78);
        if (lVar80 != 0) {
          (*_xmlFree)(lVar80);
        }
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar58 = xmlMemBlocks();
        if (iVar57 != iVar58) {
          iVar58 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderPrefix",(ulong)(uint)(iVar58 - iVar57));
          iVar56 = iVar56 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar57 = 0;
      do {
        iVar58 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        pxVar81 = (xmlNodePtr)xmlTextReaderPreserve(lVar78);
        desret_xmlNodePtr(pxVar81);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar59 = xmlMemBlocks();
        if (iVar58 != iVar59) {
          iVar59 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderPreserve",(ulong)(uint)(iVar59 - iVar58));
          iVar57 = iVar57 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      local_78 = &PTR_anon_var_dwarf_6db_0015ad08;
      iVar58 = 0;
      uVar87 = 0;
      do {
        puVar90 = &DAT_0015ad60;
        uVar94 = 0;
        do {
          iVar59 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          if (uVar94 < 4) {
            uVar75 = *puVar90;
          }
          else {
            uVar75 = 0;
          }
          xmlTextReaderPreservePattern(lVar78,uVar75,0);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar60 = xmlMemBlocks();
          if (iVar59 != iVar60) {
            iVar60 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderPreservePattern",
                   (ulong)(uint)(iVar60 - iVar59));
            iVar58 = iVar58 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d");
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      uVar87 = 0;
      iVar59 = 0;
      do {
        iVar60 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*local_78);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderQuoteChar(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar61 = xmlMemBlocks();
        if (iVar60 != iVar61) {
          iVar61 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderQuoteChar",(ulong)(uint)(iVar61 - iVar60))
          ;
          iVar59 = iVar59 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        local_78 = local_78 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar60 = 0;
      do {
        iVar61 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderRead(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar62 = xmlMemBlocks();
        if (iVar61 != iVar62) {
          iVar62 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderRead",(ulong)(uint)(iVar62 - iVar61));
          iVar60 = iVar60 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar61 = 0;
      do {
        iVar62 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderReadAttributeValue(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar63 = xmlMemBlocks();
        if (iVar62 != iVar63) {
          iVar63 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderReadAttributeValue",
                 (ulong)(uint)(iVar63 - iVar62));
          iVar61 = iVar61 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar62 = 0;
      do {
        iVar63 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderReadState(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar64 = xmlMemBlocks();
        if (iVar63 != iVar64) {
          iVar64 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderReadState",(ulong)(uint)(iVar64 - iVar63))
          ;
          iVar62 = iVar62 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      iVar63 = 0;
      uVar87 = 0;
      do {
        iVar64 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderRelaxNGSetSchema(lVar78,0);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar65 = xmlMemBlocks();
        if (iVar64 != iVar65) {
          iVar65 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderRelaxNGSetSchema",
                 (ulong)(uint)(iVar65 - iVar64));
          iVar63 = iVar63 + 1;
          printf(" %d");
          printf(" %d");
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      local_60 = &PTR_anon_var_dwarf_6db_0015ad08;
      iVar64 = 0;
      uVar87 = 0;
      do {
        puVar90 = &DAT_0015ad48;
        uVar94 = 0;
        do {
          iVar65 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          if (uVar94 < 3) {
            uVar75 = *puVar90;
          }
          else {
            uVar75 = 0;
          }
          xmlTextReaderRelaxNGValidate(lVar78,uVar75);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar66 = xmlMemBlocks();
          if (iVar65 != iVar66) {
            iVar66 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderRelaxNGValidate",
                   (ulong)(uint)(iVar66 - iVar65));
            iVar64 = iVar64 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar94 != 4);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar65 = 0;
      uVar87 = 0;
      do {
        puVar93 = &DAT_00158230;
        uVar94 = 0;
        do {
          iVar66 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          uVar92 = 0x200;
          if (uVar94 < 4) {
            uVar92 = *puVar93;
          }
          xmlTextReaderRelaxNGValidateCtxt(lVar78,0,uVar92);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar67 = xmlMemBlocks();
          if (iVar66 != iVar67) {
            iVar67 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderRelaxNGValidateCtxt",
                   (ulong)(uint)(iVar67 - iVar66));
            iVar65 = iVar65 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d",0);
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar93 = puVar93 + 1;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      uVar87 = 0;
      do {
        puVar90 = &DAT_0015ad48;
        uVar94 = 0;
        do {
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          if (uVar94 < 3) {
            uVar75 = *puVar90;
          }
          else {
            uVar75 = 0;
          }
          xmlTextReaderSchemaValidate(lVar78,uVar75);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          uVar94 = uVar94 + 1;
          puVar90 = puVar90 + 1;
        } while (uVar94 != 4);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar66 = 0;
      uVar87 = 0;
      do {
        puVar93 = &DAT_00158230;
        uVar94 = 0;
        do {
          iVar67 = xmlMemBlocks();
          if (uVar87 < 3) {
            lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
          }
          else {
            lVar78 = 0;
          }
          uVar92 = 0x200;
          if (uVar94 < 4) {
            uVar92 = *puVar93;
          }
          xmlTextReaderSchemaValidateCtxt(lVar78,0,uVar92);
          call_tests = call_tests + 1;
          if (lVar78 != 0) {
            xmlFreeTextReader(lVar78);
          }
          xmlResetLastError();
          iVar68 = xmlMemBlocks();
          if (iVar67 != iVar68) {
            iVar68 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextReaderSchemaValidateCtxt",
                   (ulong)(uint)(iVar68 - iVar67));
            iVar66 = iVar66 + 1;
            printf(" %d",(ulong)uVar87);
            printf(" %d",0);
            printf(" %d");
            putchar(10);
          }
          uVar94 = uVar94 + 1;
          puVar93 = puVar93 + 1;
        } while (uVar94 != 5);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar67 = 0;
      uVar87 = 0;
      do {
        uVar77 = 0;
        do {
          iVar68 = 0;
          puVar93 = &DAT_00158240;
          do {
            iVar69 = xmlMemBlocks();
            if (uVar87 < 3) {
              lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
            }
            else {
              lVar78 = 0;
            }
            uVar92 = 0xffffffff;
            if ((uint)uVar77 < 4) {
              uVar92 = (&DAT_00158240)[uVar77];
            }
            xmlTextReaderSetParserProp(lVar78,uVar92,*puVar93);
            call_tests = call_tests + 1;
            if (lVar78 != 0) {
              xmlFreeTextReader(lVar78);
            }
            xmlResetLastError();
            iVar70 = xmlMemBlocks();
            if (iVar69 != iVar70) {
              iVar70 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextReaderSetParserProp",
                     (ulong)(uint)(iVar70 - iVar69));
              iVar67 = iVar67 + 1;
              printf(" %d",(ulong)uVar87);
              printf(" %d",uVar77);
              printf(" %d");
              putchar(10);
            }
            iVar68 = iVar68 + 1;
            puVar93 = puVar93 + 1;
          } while (iVar68 != 4);
          uVar94 = (uint)uVar77 + 1;
          uVar77 = (ulong)uVar94;
        } while (uVar94 != 4);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      iVar68 = 0;
      uVar87 = 0;
      do {
        iVar69 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*local_60);
        }
        else {
          lVar78 = 0;
        }
        pxVar74 = (xmlParserInputBufferPtr)0x0;
        xmlTextReaderSetSchema(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar70 = xmlMemBlocks();
        if (iVar69 != iVar70) {
          iVar70 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderSetSchema",(ulong)(uint)(iVar70 - iVar69))
          ;
          iVar68 = iVar68 + 1;
          printf(" %d");
          pxVar74 = (xmlParserInputBufferPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        local_60 = local_60 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      local_48 = &PTR_anon_var_dwarf_6db_0015ad08;
      iVar69 = 0;
      uVar87 = 0;
      do {
        uVar94 = 0;
        do {
          uVar84 = 0;
          do {
            uVar77 = 0;
            do {
              pxVar88 = (xmlParserInputBufferPtr)0x0;
              puVar93 = &DAT_00158230;
              do {
                iVar71 = (int)pxVar74;
                iVar70 = xmlMemBlocks();
                if (uVar87 < 3) {
                  lVar78 = xmlNewTextReaderFilename((&PTR_anon_var_dwarf_6db_0015ad08)[uVar87]);
                }
                else {
                  lVar78 = 0;
                }
                pxVar74 = gen_xmlParserInputBufferPtr(uVar94,iVar71);
                if (uVar84 < 7) {
                  uVar75 = (&DAT_0015ad80)[uVar84];
                }
                else {
                  uVar75 = 0;
                }
                if ((uint)uVar77 < 3) {
                  uVar83 = (&DAT_0015ad48)[uVar77];
                }
                else {
                  uVar83 = 0;
                }
                uVar92 = 0x200;
                uVar85 = (uint)pxVar88;
                if (uVar85 < 4) {
                  uVar92 = *puVar93;
                }
                xmlTextReaderSetup(lVar78,pxVar74,uVar75,uVar83,uVar92);
                call_tests = call_tests + 1;
                if (lVar78 != 0) {
                  xmlFreeTextReader(lVar78);
                }
                xmlResetLastError();
                iVar71 = xmlMemBlocks();
                if (iVar70 != iVar71) {
                  iVar71 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlTextReaderSetup",
                         (ulong)(uint)(iVar71 - iVar70));
                  iVar69 = iVar69 + 1;
                  printf(" %d",(ulong)uVar87);
                  printf(" %d",(ulong)uVar94);
                  printf(" %d",(ulong)uVar84);
                  printf(" %d",uVar77);
                  printf(" %d");
                  putchar(10);
                  pxVar74 = pxVar88;
                }
                uVar85 = uVar85 + 1;
                pxVar88 = (xmlParserInputBufferPtr)(ulong)uVar85;
                puVar93 = puVar93 + 1;
              } while (uVar85 != 5);
              uVar85 = (uint)uVar77 + 1;
              uVar77 = (ulong)uVar85;
            } while (uVar85 != 4);
            uVar84 = uVar84 + 1;
          } while (uVar84 != 8);
          uVar94 = uVar94 + 1;
        } while (uVar94 != 8);
        uVar87 = uVar87 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      uVar87 = 0;
      local_88 = 0;
      do {
        iVar70 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*local_48);
        }
        else {
          lVar78 = 0;
        }
        xmlTextReaderStandalone(lVar78);
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar71 = xmlMemBlocks();
        if (iVar70 != iVar71) {
          iVar71 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderStandalone",(ulong)(uint)(iVar71 - iVar70)
                );
          local_88 = local_88 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        local_48 = local_48 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar70 = 0;
      do {
        iVar71 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        lVar80 = xmlTextReaderValue(lVar78);
        if (lVar80 != 0) {
          (*_xmlFree)(lVar80);
        }
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar72 = xmlMemBlocks();
        if (iVar71 != iVar72) {
          iVar72 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderValue",(ulong)(uint)(iVar72 - iVar71));
          iVar70 = iVar70 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      ppuVar91 = &PTR_anon_var_dwarf_6db_0015ad08;
      uVar87 = 0;
      iVar71 = 0;
      do {
        iVar72 = xmlMemBlocks();
        if (uVar87 < 3) {
          lVar78 = xmlNewTextReaderFilename(*ppuVar91);
        }
        else {
          lVar78 = 0;
        }
        lVar80 = xmlTextReaderXmlLang(lVar78);
        if (lVar80 != 0) {
          (*_xmlFree)(lVar80);
        }
        call_tests = call_tests + 1;
        if (lVar78 != 0) {
          xmlFreeTextReader(lVar78);
        }
        xmlResetLastError();
        iVar73 = xmlMemBlocks();
        if (iVar72 != iVar73) {
          iVar73 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextReaderXmlLang",(ulong)(uint)(iVar73 - iVar72));
          iVar71 = iVar71 + 1;
          printf(" %d",(ulong)uVar87);
          putchar(10);
        }
        uVar87 = uVar87 + 1;
        ppuVar91 = ppuVar91 + 1;
      } while (uVar87 != 4);
      function_tests = function_tests + 1;
      uVar87 = iVar43 + iVar44 +
               iVar28 + iVar29 +
               iVar23 + iVar24 +
               iVar1 + iVar3 + local_3c + local_40 + local_58 + iVar4 + iVar5 + iVar7 + iVar6 +
               iVar8 + iVar9 + iVar10 + iVar11 + iVar12 + iVar13 + iVar14 + iVar15 + iVar16 + iVar17
               + iVar18 + iVar19 + iVar20 + iVar21 + iVar22 + iVar25 + iVar26 + iVar27 + iVar30 +
               iVar31 + iVar32 + iVar33 + iVar34 + iVar35 + iVar36 + iVar37 + iVar38 +
               (uint)(iVar39 != iVar40) + (uint)(iVar41 != iVar42) + iVar45 + iVar46 + iVar47 +
               iVar48 + iVar49 + iVar50 + iVar51 + iVar52 + iVar53 + iVar54 + iVar55 + iVar56 +
               iVar57 + iVar58 + iVar59 + iVar60 + iVar61 + iVar62 + iVar63 + iVar64 + iVar65 +
               iVar66 + iVar67 + iVar68 + iVar69 + local_88 + iVar70 + iVar71;
      if (uVar87 != 0) {
        printf("Module xmlreader: %d errors\n",(ulong)uVar87);
      }
      return uVar87;
    }
  } while( true );
}

Assistant:

static int
test_xmlreader(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlreader : 76 of 89 functions ...\n");
    test_ret += test_xmlNewTextReader();
    test_ret += test_xmlNewTextReaderFilename();
    test_ret += test_xmlReaderForDoc();
    test_ret += test_xmlReaderForFile();
    test_ret += test_xmlReaderForMemory();
    test_ret += test_xmlReaderNewDoc();
    test_ret += test_xmlReaderNewFile();
    test_ret += test_xmlReaderNewMemory();
    test_ret += test_xmlReaderNewWalker();
    test_ret += test_xmlReaderWalker();
    test_ret += test_xmlTextReaderAttributeCount();
    test_ret += test_xmlTextReaderBaseUri();
    test_ret += test_xmlTextReaderByteConsumed();
    test_ret += test_xmlTextReaderClose();
    test_ret += test_xmlTextReaderConstBaseUri();
    test_ret += test_xmlTextReaderConstEncoding();
    test_ret += test_xmlTextReaderConstLocalName();
    test_ret += test_xmlTextReaderConstName();
    test_ret += test_xmlTextReaderConstNamespaceUri();
    test_ret += test_xmlTextReaderConstPrefix();
    test_ret += test_xmlTextReaderConstString();
    test_ret += test_xmlTextReaderConstValue();
    test_ret += test_xmlTextReaderConstXmlLang();
    test_ret += test_xmlTextReaderConstXmlVersion();
    test_ret += test_xmlTextReaderCurrentDoc();
    test_ret += test_xmlTextReaderCurrentNode();
    test_ret += test_xmlTextReaderDepth();
    test_ret += test_xmlTextReaderExpand();
    test_ret += test_xmlTextReaderGetAttribute();
    test_ret += test_xmlTextReaderGetAttributeNo();
    test_ret += test_xmlTextReaderGetAttributeNs();
    test_ret += test_xmlTextReaderGetErrorHandler();
    test_ret += test_xmlTextReaderGetLastError();
    test_ret += test_xmlTextReaderGetParserColumnNumber();
    test_ret += test_xmlTextReaderGetParserLineNumber();
    test_ret += test_xmlTextReaderGetParserProp();
    test_ret += test_xmlTextReaderGetRemainder();
    test_ret += test_xmlTextReaderHasAttributes();
    test_ret += test_xmlTextReaderHasValue();
    test_ret += test_xmlTextReaderIsDefault();
    test_ret += test_xmlTextReaderIsEmptyElement();
    test_ret += test_xmlTextReaderIsNamespaceDecl();
    test_ret += test_xmlTextReaderIsValid();
    test_ret += test_xmlTextReaderLocalName();
    test_ret += test_xmlTextReaderLocatorBaseURI();
    test_ret += test_xmlTextReaderLocatorLineNumber();
    test_ret += test_xmlTextReaderLookupNamespace();
    test_ret += test_xmlTextReaderMoveToAttribute();
    test_ret += test_xmlTextReaderMoveToAttributeNo();
    test_ret += test_xmlTextReaderMoveToAttributeNs();
    test_ret += test_xmlTextReaderMoveToElement();
    test_ret += test_xmlTextReaderMoveToFirstAttribute();
    test_ret += test_xmlTextReaderMoveToNextAttribute();
    test_ret += test_xmlTextReaderName();
    test_ret += test_xmlTextReaderNamespaceUri();
    test_ret += test_xmlTextReaderNext();
    test_ret += test_xmlTextReaderNextSibling();
    test_ret += test_xmlTextReaderNodeType();
    test_ret += test_xmlTextReaderNormalization();
    test_ret += test_xmlTextReaderPrefix();
    test_ret += test_xmlTextReaderPreserve();
    test_ret += test_xmlTextReaderPreservePattern();
    test_ret += test_xmlTextReaderQuoteChar();
    test_ret += test_xmlTextReaderRead();
    test_ret += test_xmlTextReaderReadAttributeValue();
    test_ret += test_xmlTextReaderReadState();
    test_ret += test_xmlTextReaderRelaxNGSetSchema();
    test_ret += test_xmlTextReaderRelaxNGValidate();
    test_ret += test_xmlTextReaderRelaxNGValidateCtxt();
    test_ret += test_xmlTextReaderSchemaValidate();
    test_ret += test_xmlTextReaderSchemaValidateCtxt();
    test_ret += test_xmlTextReaderSetErrorHandler();
    test_ret += test_xmlTextReaderSetMaxAmplification();
    test_ret += test_xmlTextReaderSetParserProp();
    test_ret += test_xmlTextReaderSetResourceLoader();
    test_ret += test_xmlTextReaderSetSchema();
    test_ret += test_xmlTextReaderSetStructuredErrorHandler();
    test_ret += test_xmlTextReaderSetup();
    test_ret += test_xmlTextReaderStandalone();
    test_ret += test_xmlTextReaderValue();
    test_ret += test_xmlTextReaderXmlLang();

    if (test_ret != 0)
	printf("Module xmlreader: %d errors\n", test_ret);
    return(test_ret);
}